

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

int luv_os_get_passwd(lua_State *L)

{
  int iVar1;
  uv_passwd_t pwd;
  
  iVar1 = uv_os_get_passwd(&pwd);
  if (iVar1 < 0) {
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    lua_createtable(L,0,0);
    if (pwd.username != (char *)0x0) {
      lua_pushstring(L,pwd.username);
      lua_setfield(L,-2,"username");
    }
    if (-1 < pwd.uid) {
      lua_pushinteger(L,pwd.uid);
      lua_setfield(L,-2,"uid");
    }
    if (-1 < pwd.gid) {
      lua_pushinteger(L,pwd.gid);
      lua_setfield(L,-2,"gid");
    }
    if (pwd.shell != (char *)0x0) {
      lua_pushstring(L,pwd.shell);
      lua_setfield(L,-2,"shell");
    }
    if (pwd.homedir != (char *)0x0) {
      lua_pushstring(L,pwd.homedir);
      lua_setfield(L,-2,"homedir");
    }
    uv_os_free_passwd(&pwd);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_os_get_passwd(lua_State* L) {
  uv_passwd_t pwd;
  int ret = uv_os_get_passwd(&pwd);
  if (ret < 0) return luv_error(L, ret);
  lua_newtable(L);
  if (pwd.username) {
    lua_pushstring(L, pwd.username);
    lua_setfield(L, -2, "username");
  }
  if (pwd.uid >= 0) {
    lua_pushinteger(L, pwd.uid);
    lua_setfield(L, -2, "uid");
  }
  if (pwd.gid >= 0) {
    lua_pushinteger(L, pwd.gid);
    lua_setfield(L, -2, "gid");
  }
  if (pwd.shell) {
    lua_pushstring(L, pwd.shell);
    lua_setfield(L, -2, "shell");
  }
  if (pwd.homedir) {
    lua_pushstring(L, pwd.homedir);
    lua_setfield(L, -2, "homedir");
  }
  uv_os_free_passwd(&pwd);
  return 1;
}